

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-arithmetic.c
# Opt level: O2

WeierstrassPoint * ecc_weierstrass_point_copy(WeierstrassPoint *orig)

{
  WeierstrassPoint *pWVar1;
  mp_int *pmVar2;
  
  pWVar1 = ecc_weierstrass_point_new_empty(orig->wc);
  pmVar2 = mp_copy(orig->X);
  pWVar1->X = pmVar2;
  pmVar2 = mp_copy(orig->Y);
  pWVar1->Y = pmVar2;
  pmVar2 = mp_copy(orig->Z);
  pWVar1->Z = pmVar2;
  return pWVar1;
}

Assistant:

WeierstrassPoint *ecc_weierstrass_point_copy(WeierstrassPoint *orig)
{
    WeierstrassPoint *wp = ecc_weierstrass_point_new_empty(orig->wc);
    wp->X = mp_copy(orig->X);
    wp->Y = mp_copy(orig->Y);
    wp->Z = mp_copy(orig->Z);
    return wp;
}